

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

WaitForkStatement * __thiscall
slang::BumpAllocator::emplace<slang::ast::WaitForkStatement,slang::SourceRange>
          (BumpAllocator *this,SourceRange *args)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  WaitForkStatement *pWVar3;
  
  pWVar3 = (WaitForkStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((WaitForkStatement *)this->endPtr < pWVar3 + 1) {
    pWVar3 = (WaitForkStatement *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pWVar3 + 1);
  }
  SVar1 = args->startLoc;
  SVar2 = args->endLoc;
  (pWVar3->super_Statement).kind = WaitFork;
  (pWVar3->super_Statement).syntax = (StatementSyntax *)0x0;
  (pWVar3->super_Statement).sourceRange.startLoc = SVar1;
  (pWVar3->super_Statement).sourceRange.endLoc = SVar2;
  return pWVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }